

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctrdrbg_test.cc
# Opt level: O0

void __thiscall CTRDRBGTest_Large_Test::TestBody(CTRDRBGTest_Large_Test *this)

{
  bool bVar1;
  char *pcVar2;
  pointer puVar3;
  char *in_R9;
  AssertHelper local_2b8;
  Message local_2b0;
  Span<const_unsigned_char> local_2a8;
  Bytes local_298;
  Span<const_unsigned_char> local_288;
  Bytes local_278;
  undefined1 local_268 [8];
  AssertionResult gtest_ar;
  uint8_t kExpected [32];
  uint8_t digest [32];
  AssertHelper local_1f8;
  Message local_1f0;
  int local_1e4;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar__1;
  __array buf;
  string local_1c0;
  AssertHelper local_1a0;
  Message local_198 [3];
  int local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_;
  CTR_DRBG_STATE drbg;
  uint8_t kSeed [48];
  CTRDRBGTest_Large_Test *this_local;
  
  drbg.reseed_counter = 0;
  local_17c = CTR_DRBG_init((CTR_DRBG_STATE *)&gtest_ar_.message_,(uint8_t *)&drbg.reseed_counter,
                            (uint8_t *)0x0,0);
  testing::AssertionResult::AssertionResult<int>
            ((AssertionResult *)local_178,&local_17c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1c0,(internal *)local_178,
               (AssertionResult *)"CTR_DRBG_init(&drbg, kSeed, nullptr, 0)","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/rand/ctrdrbg_test.cc"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    testing::Message::~Message(local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  if (bVar1) {
    std::make_unique<unsigned_char[]>((size_t)&gtest_ar__1.message_);
    puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        &gtest_ar__1.message_);
    local_1e4 = CTR_DRBG_generate((CTR_DRBG_STATE *)&gtest_ar_.message_,puVar3,0x10000,
                                  (uint8_t *)0x0,0);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_1e0,&local_1e4,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
    if (!bVar1) {
      testing::Message::Message(&local_1f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)(digest + 0x18),(internal *)local_1e0,
                 (AssertionResult *)"CTR_DRBG_generate(&drbg, buf.get(), 65536, nullptr, 0)","false"
                 ,"true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1f8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/rand/ctrdrbg_test.cc"
                 ,0x51,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper(&local_1f8);
      std::__cxx11::string::~string((string *)(digest + 0x18));
      testing::Message::~Message(&local_1f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
    if (bVar1) {
      puVar3 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          &gtest_ar__1.message_);
      SHA256(puVar3,0x10000,kExpected + 0x18);
      kExpected[8] = 0xa0;
      kExpected[9] = 'K';
      kExpected[10] = 0x91;
      kExpected[0xb] = 'X';
      kExpected[0xc] = '<';
      kExpected[0xd] = 0xf4;
      kExpected[0xe] = 0xe3;
      kExpected[0xf] = 'm';
      kExpected[0x10] = 0xff;
      kExpected[0x11] = 'A';
      kExpected[0x12] = 0xbf;
      kExpected[0x13] = 0xb9;
      kExpected[0x14] = 0xf8;
      kExpected[0x15] = 0xa8;
      kExpected[0x16] = '\x1c';
      kExpected[0x17] = '+';
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x6a3fc0ca96157869;
      kExpected[0] = 'm';
      kExpected[1] = 0xed;
      kExpected[2] = '\"';
      kExpected[3] = '\x1e';
      kExpected[4] = '&';
      kExpected[5] = 0xd0;
      kExpected[6] = 'u';
      kExpected[7] = 'I';
      bssl::Span<unsigned_char_const>::Span<32ul>
                ((Span<unsigned_char_const> *)&local_288,(uchar (*) [32])&gtest_ar.message_);
      Bytes::Bytes(&local_278,local_288);
      bssl::Span<unsigned_char_const>::Span<32ul>
                ((Span<unsigned_char_const> *)&local_2a8,(uchar (*) [32])(kExpected + 0x18));
      Bytes::Bytes(&local_298,local_2a8);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_268,"Bytes(kExpected)","Bytes(digest)",&local_278,&local_298);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
      if (!bVar1) {
        testing::Message::Message(&local_2b0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/rand/ctrdrbg_test.cc"
                   ,0x5b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
        testing::internal::AssertHelper::~AssertHelper(&local_2b8);
        testing::Message::~Message(&local_2b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
      CTR_DRBG_clear((CTR_DRBG_STATE *)&gtest_ar_.message_);
    }
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
               &gtest_ar__1.message_);
  }
  return;
}

Assistant:

TEST(CTRDRBGTest, Large) {
  const uint8_t kSeed[CTR_DRBG_ENTROPY_LEN] = {0};

  CTR_DRBG_STATE drbg;
  ASSERT_TRUE(CTR_DRBG_init(&drbg, kSeed, nullptr, 0));

  auto buf = std::make_unique<uint8_t[]>(CTR_DRBG_MAX_GENERATE_LENGTH);
  ASSERT_TRUE(CTR_DRBG_generate(&drbg, buf.get(), CTR_DRBG_MAX_GENERATE_LENGTH,
                                nullptr, 0));

  uint8_t digest[SHA256_DIGEST_LENGTH];
  SHA256(buf.get(), CTR_DRBG_MAX_GENERATE_LENGTH, digest);

  const uint8_t kExpected[SHA256_DIGEST_LENGTH] = {
      0x69, 0x78, 0x15, 0x96, 0xca, 0xc0, 0x3f, 0x6a, 0x6d, 0xed, 0x22,
      0x1e, 0x26, 0xd0, 0x75, 0x49, 0xa0, 0x4b, 0x91, 0x58, 0x3c, 0xf4,
      0xe3, 0x6d, 0xff, 0x41, 0xbf, 0xb9, 0xf8, 0xa8, 0x1c, 0x2b,
  };
  EXPECT_EQ(Bytes(kExpected), Bytes(digest));

  CTR_DRBG_clear(&drbg);
}